

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O3

void __thiscall tonk::Connection::onTimerError(Connection *this,error_code *error)

{
  int iVar1;
  ErrorResult *pEVar2;
  Result local_40;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  (**(code **)(*(long *)error->_M_cat + 0x20))(&local_38,error->_M_cat,error->_M_value);
  iVar1 = error->_M_value;
  pEVar2 = (ErrorResult *)operator_new(0x38);
  pEVar2->Source = "Connection::onTimerError";
  (pEVar2->Description)._M_dataplus._M_p = (pointer)&(pEVar2->Description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pEVar2->Description,local_38,local_38 + local_30);
  pEVar2->Type = Asio;
  pEVar2->Code = (long)iVar1;
  local_40.Error = pEVar2;
  RefCounter::StartShutdown(&(this->super_IConnection).SelfRefCount,6,&local_40);
  Result::~Result(&local_40);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  reportClose(this);
  removeFromMaps(this);
  return;
}

Assistant:

void Connection::onTimerError(const asio::error_code& error)
{
    /*
        Our Timer failed for some reason unexpectedly.  Maybe this happens during shutdown.
        This error is not recoverable so we should begin the disconnect process.
    */
    SelfRefCount.StartShutdown(Tonk_NetworkFailed,
        Result("Connection::onTimerError",
            error.message(),
            ErrorType::Asio,
            error.value()));

    // Report close to application since timer will no longer fire
    reportClose();

    removeFromMaps();
}